

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O1

CompressedTexFormat tcu::getAstcFormatByBlockSize(IVec3 *size,bool isSRGB)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  InternalError *pIVar4;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  CompressedTexFormat unaff_EBP;
  CompressedTexFormat fmt;
  CompressedTexFormat format;
  bool bVar8;
  string local_140;
  int local_11c;
  int local_118;
  int local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (1 < size->m_data[2]) {
    pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"3D ASTC textures not currently supported","");
    InternalError::InternalError(pIVar4,&local_140);
    __cxa_throw(pIVar4,&InternalError::typeinfo,Exception::~Exception);
  }
  iVar1 = size->m_data[0];
  bVar8 = false;
  format = COMPRESSEDTEXFORMAT_ETC1_RGB8;
  do {
    if (format - COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA < 0x1c) {
      getBlockPixelSize((tcu *)&local_140,format);
      if ((int)local_140._M_dataplus._M_p != iVar1) goto LAB_0030b459;
      uVar2 = 0;
      do {
        uVar6 = uVar2;
        if (uVar6 == 2) break;
        uVar2 = uVar6 + 1;
      } while (*(int *)((long)&local_140._M_dataplus._M_p + uVar6 * 4 + 4) ==
               size->m_data[uVar6 + 1]);
      if (uVar6 < 2) goto LAB_0030b459;
      bVar3 = format - COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8 < 0xe != isSRGB;
      if (!bVar3) {
        unaff_EBP = format;
      }
    }
    else {
LAB_0030b459:
      bVar3 = true;
    }
    if (!bVar3) break;
    bVar8 = COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8 < format;
    format = format + COMPRESSEDTEXFORMAT_EAC_R11;
  } while (format != COMPRESSEDTEXFORMAT_LAST);
  if (bVar8) {
    pIVar4 = (InternalError *)__cxa_allocate_exception(0x38);
    local_114 = size->m_data[0];
    de::toString<int>(&local_90,&local_114);
    std::operator+(&local_70,"Invalid ASTC block size ",&local_90);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_110._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_110._M_dataplus._M_p == psVar7) {
      local_110.field_2._M_allocated_capacity = *psVar7;
      local_110.field_2._8_8_ = plVar5[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar7;
    }
    local_110._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_118 = size->m_data[1];
    de::toString<int>(&local_b0,&local_118);
    std::operator+(&local_50,&local_110,&local_b0);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_f0._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_f0._M_dataplus._M_p == psVar7) {
      local_f0.field_2._M_allocated_capacity = *psVar7;
      local_f0.field_2._8_8_ = plVar5[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar7;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_11c = size->m_data[2];
    de::toString<int>(&local_d0,&local_11c);
    std::operator+(&local_140,&local_f0,&local_d0);
    InternalError::InternalError(pIVar4,&local_140);
    __cxa_throw(pIVar4,&InternalError::typeinfo,Exception::~Exception);
  }
  return unaff_EBP;
}

Assistant:

CompressedTexFormat getAstcFormatByBlockSize (const IVec3& size, bool isSRGB)
{
	if (size.z() > 1)
		throw InternalError("3D ASTC textures not currently supported");

	for (int fmtI = 0; fmtI < COMPRESSEDTEXFORMAT_LAST; fmtI++)
	{
		const CompressedTexFormat fmt = (CompressedTexFormat)fmtI;

		if (isAstcFormat(fmt) && getBlockPixelSize(fmt) == size && isAstcSRGBFormat(fmt) == isSRGB)
			return fmt;
	}

	throw InternalError("Invalid ASTC block size " + de::toString(size.x()) + "x" + de::toString(size.y()) + "x" + de::toString(size.z()));
}